

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall QLocale::QLocale(QLocale *this)

{
  Type *pTVar1;
  
  (this->d).d.ptr = (QLocalePrivate *)c_private()::c_locale;
  LOCK();
  c_private()::c_locale._8_4_ = c_private()::c_locale._8_4_ + 1;
  UNLOCK();
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>::guard.
            _q_value.super___atomic_base<signed_char>._M_i < -1) {
    return;
  }
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
           ::instance();
  QSharedDataPointer<QLocalePrivate>::reset(&this->d,(pTVar1->d).ptr);
  return;
}

Assistant:

explicit constexpr totally_ordered_wrapper(P p) noexcept : ptr(p) {}